

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

Node * __thiscall
llbuild::buildsystem::BuildDescription::addNode
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
          *value)

{
  pointer pNVar1;
  node_set *this_00;
  pointer this_01;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_> *this_02;
  StringRef Key;
  Node *result;
  unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
  *value_local;
  BuildDescription *this_local;
  
  pNVar1 = std::
           unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
           ::get(value);
  this_00 = getNodes(this);
  this_01 = std::
            unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>
            ::operator->(value);
  Key = Node::getName(this_01);
  this_02 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>,_llvm::MallocAllocator>
            ::operator[](this_00,Key);
  std::unique_ptr<llbuild::buildsystem::Node,_std::default_delete<llbuild::buildsystem::Node>_>::
  operator=(this_02,value);
  return pNVar1;
}

Assistant:

Node& BuildDescription::addNode(std::unique_ptr<Node> value) {
  auto& result = *value.get();
  getNodes()[value->getName()] = std::move(value);
  return result;
}